

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_access_block_segment_ptr(Integer g_a,Integer proc,void *ptr,Integer *len)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  Integer IVar4;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int grp;
  Integer index;
  Integer handle;
  char *lptr;
  Integer in_stack_00000148;
  char *in_stack_00000150;
  
  lVar3 = in_RDI + 1000;
  iVar1 = GA[lVar3].p_handle;
  if (-1 < in_RSI) {
    IVar4 = pnga_pgroup_nnodes((long)iVar1);
    if (in_RSI < IVar4) goto LAB_001eafdc;
  }
  pnga_error(in_stack_00000150,in_stack_00000148);
LAB_001eafdc:
  IVar4 = pnga_pgroup_nodeid((long)iVar1);
  if (in_RSI != IVar4) {
    pnga_error(in_stack_00000150,in_stack_00000148);
  }
  pcVar2 = GA[lVar3].ptr[in_RSI];
  *in_RCX = GA[lVar3].size / (long)GA[lVar3].elemsize;
  *in_RDX = pcVar2;
  return;
}

Assistant:

void pnga_access_block_segment_ptr(Integer g_a, Integer proc, void* ptr, Integer *len)
            /* g_a:  array handle [input]
             * proc: processor for data [input]
             * ptr:  pointer to data start of data on processor [output]
             * len:  length of data contained on processor [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  /*Integer  p_handle, nblocks;*/
  Integer /*ndim,*/ index;
  int grp = GA[handle].p_handle;

  
  /*p_handle = GA[handle].p_handle;*/
  /*nblocks = GA[handle].block_total;*/
  /*ndim = GA[handle].ndim;*/
  index = proc;
  if (index < 0 || index >= pnga_pgroup_nnodes(grp))
    pnga_error("processor index outside allowed values",index);

  if (index != pnga_pgroup_nodeid(grp))
    pnga_error("Only get accurate number of elements for processor making request",0);
  lptr = GA[handle].ptr[index];

  *len = GA[handle].size/GA[handle].elemsize;
  *(char**)ptr = lptr; 
}